

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrame(void)

{
  undefined3 uVar1;
  bool bVar2;
  int iVar3;
  ImGuiContextHook *pIVar4;
  ImVector<ImGuiContextHook> *this;
  ImFont *font;
  ImGuiViewportP **ppIVar5;
  ImGuiWindow *pIVar6;
  ImGuiWindow **ppIVar7;
  float *pfVar8;
  ImGuiTable *table;
  ImGuiTableTempData *pIVar9;
  float fVar10;
  ImVec4 IVar11;
  float local_90;
  float local_8c;
  ImVec2 local_7c;
  int local_74;
  int local_70;
  int local_6c;
  int i_2;
  int i_1;
  ImGuiWindow *window;
  int i;
  float memory_compact_start_time;
  ImGuiViewportP *viewport;
  undefined4 uStack_48;
  int n_2;
  undefined4 local_40;
  undefined4 uStack_3c;
  ImRect local_38;
  int local_28;
  undefined1 local_24 [4];
  int n_1;
  ImRect virtual_space;
  int n;
  ImGuiContext *g;
  
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x1140,"void ImGui::NewFrame()");
  }
  stack0xfffffffffffffff0 = GImGui;
  virtual_space.Max.x = (float)(GImGui->Hooks).Size;
  while (virtual_space.Max.x = (float)((int)virtual_space.Max.x + -1), -1 < (int)virtual_space.Max.x
        ) {
    pIVar4 = ImVector<ImGuiContextHook>::operator[]
                       (&stack0xfffffffffffffff0->Hooks,(int)virtual_space.Max.x);
    if (*(int *)(pIVar4 + 4) == 7) {
      this = &stack0xfffffffffffffff0->Hooks;
      pIVar4 = ImVector<ImGuiContextHook>::operator[]
                         (&stack0xfffffffffffffff0->Hooks,(int)virtual_space.Max.x);
      ImVector<ImGuiContextHook>::erase(this,pIVar4);
    }
  }
  CallContextHooks(stack0xfffffffffffffff0,ImGuiContextHookType_NewFramePre);
  stack0xfffffffffffffff0->ConfigFlagsLastFrame = stack0xfffffffffffffff0->ConfigFlagsCurrFrame;
  ErrorCheckNewFrameSanityChecks();
  stack0xfffffffffffffff0->ConfigFlagsCurrFrame = (stack0xfffffffffffffff0->IO).ConfigFlags;
  UpdateSettings();
  stack0xfffffffffffffff0->Time =
       (double)(stack0xfffffffffffffff0->IO).DeltaTime + stack0xfffffffffffffff0->Time;
  stack0xfffffffffffffff0->WithinFrameScope = true;
  stack0xfffffffffffffff0->FrameCount = stack0xfffffffffffffff0->FrameCount + 1;
  stack0xfffffffffffffff0->TooltipOverrideCount = 0;
  stack0xfffffffffffffff0->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize(&stack0xfffffffffffffff0->MenusIdSubmittedThisFrame,0);
  stack0xfffffffffffffff0->FramerateSecPerFrameAccum =
       ((stack0xfffffffffffffff0->IO).DeltaTime -
       stack0xfffffffffffffff0->FramerateSecPerFrame
       [stack0xfffffffffffffff0->FramerateSecPerFrameIdx]) +
       stack0xfffffffffffffff0->FramerateSecPerFrameAccum;
  stack0xfffffffffffffff0->FramerateSecPerFrame[stack0xfffffffffffffff0->FramerateSecPerFrameIdx] =
       (stack0xfffffffffffffff0->IO).DeltaTime;
  stack0xfffffffffffffff0->FramerateSecPerFrameIdx =
       (stack0xfffffffffffffff0->FramerateSecPerFrameIdx + 1) % 0x78;
  iVar3 = ImMin<int>(stack0xfffffffffffffff0->FramerateSecPerFrameCount + 1,0x78);
  stack0xfffffffffffffff0->FramerateSecPerFrameCount = iVar3;
  if (stack0xfffffffffffffff0->FramerateSecPerFrameAccum <= 0.0) {
    local_8c = 3.4028235e+38;
  }
  else {
    local_8c = 1.0 / (stack0xfffffffffffffff0->FramerateSecPerFrameAccum /
                     (float)stack0xfffffffffffffff0->FramerateSecPerFrameCount);
  }
  (stack0xfffffffffffffff0->IO).Framerate = local_8c;
  UpdateViewportsNewFrame();
  ((stack0xfffffffffffffff0->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  bVar2 = ImFont::IsLoaded(stack0xfffffffffffffff0->Font);
  if (!bVar2) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x1167,"void ImGui::NewFrame()");
  }
  ImRect::ImRect((ImRect *)local_24,3.4028235e+38,3.4028235e+38,-3.4028235e+38,-3.4028235e+38);
  for (local_28 = 0; local_28 < (stack0xfffffffffffffff0->Viewports).Size; local_28 = local_28 + 1)
  {
    ppIVar5 = ImVector<ImGuiViewportP_*>::operator[](&stack0xfffffffffffffff0->Viewports,local_28);
    local_38 = ImGuiViewportP::GetMainRect(*ppIVar5);
    ImRect::Add((ImRect *)local_24,&local_38);
  }
  IVar11 = ImRect::ToVec4((ImRect *)local_24);
  _uStack_48 = IVar11._0_8_;
  (unique0x1000118b->DrawListSharedData).ClipRectFullscreen.x = (float)uStack_48;
  (unique0x1000118b->DrawListSharedData).ClipRectFullscreen.y = (float)n_2;
  _local_40 = IVar11._8_8_;
  (unique0x1000118b->DrawListSharedData).ClipRectFullscreen.z = (float)local_40;
  (unique0x1000118b->DrawListSharedData).ClipRectFullscreen.w = (float)uStack_3c;
  (stack0xfffffffffffffff0->DrawListSharedData).CurveTessellationTol =
       (stack0xfffffffffffffff0->Style).CurveTessellationTol;
  _uStack_48 = IVar11;
  ImDrawListSharedData::SetCircleTessellationMaxError
            (&stack0xfffffffffffffff0->DrawListSharedData,
             (stack0xfffffffffffffff0->Style).CircleTessellationMaxError);
  (stack0xfffffffffffffff0->DrawListSharedData).InitialFlags = 0;
  if (((stack0xfffffffffffffff0->Style).AntiAliasedLines & 1U) != 0) {
    (stack0xfffffffffffffff0->DrawListSharedData).InitialFlags =
         (stack0xfffffffffffffff0->DrawListSharedData).InitialFlags | 1;
  }
  if ((((stack0xfffffffffffffff0->Style).AntiAliasedLinesUseTex & 1U) != 0) &&
     ((stack0xfffffffffffffff0->Font->ContainerAtlas->Flags & 4U) == 0)) {
    (stack0xfffffffffffffff0->DrawListSharedData).InitialFlags =
         (stack0xfffffffffffffff0->DrawListSharedData).InitialFlags | 2;
  }
  if (((stack0xfffffffffffffff0->Style).AntiAliasedFill & 1U) != 0) {
    (stack0xfffffffffffffff0->DrawListSharedData).InitialFlags =
         (stack0xfffffffffffffff0->DrawListSharedData).InitialFlags | 4;
  }
  if (((stack0xfffffffffffffff0->IO).BackendFlags & 8U) != 0) {
    (stack0xfffffffffffffff0->DrawListSharedData).InitialFlags =
         (stack0xfffffffffffffff0->DrawListSharedData).InitialFlags | 8;
  }
  for (viewport._4_4_ = 0; viewport._4_4_ < (stack0xfffffffffffffff0->Viewports).Size;
      viewport._4_4_ = viewport._4_4_ + 1) {
    ppIVar5 = ImVector<ImGuiViewportP_*>::operator[]
                        (&stack0xfffffffffffffff0->Viewports,viewport._4_4_);
    _i = *ppIVar5;
    (_i->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
    ImDrawData::Clear(&_i->DrawDataP);
  }
  if (((stack0xfffffffffffffff0->DragDropActive & 1U) != 0) &&
     ((stack0xfffffffffffffff0->DragDropPayload).SourceId == stack0xfffffffffffffff0->ActiveId)) {
    KeepAliveID((stack0xfffffffffffffff0->DragDropPayload).SourceId);
  }
  if (stack0xfffffffffffffff0->HoveredIdPreviousFrame == 0) {
    stack0xfffffffffffffff0->HoveredIdTimer = 0.0;
  }
  if ((stack0xfffffffffffffff0->HoveredIdPreviousFrame == 0) ||
     ((stack0xfffffffffffffff0->HoveredId != 0 &&
      (stack0xfffffffffffffff0->ActiveId == stack0xfffffffffffffff0->HoveredId)))) {
    stack0xfffffffffffffff0->HoveredIdNotActiveTimer = 0.0;
  }
  if (stack0xfffffffffffffff0->HoveredId != 0) {
    stack0xfffffffffffffff0->HoveredIdTimer =
         (stack0xfffffffffffffff0->IO).DeltaTime + stack0xfffffffffffffff0->HoveredIdTimer;
  }
  if ((stack0xfffffffffffffff0->HoveredId != 0) &&
     (stack0xfffffffffffffff0->ActiveId != stack0xfffffffffffffff0->HoveredId)) {
    stack0xfffffffffffffff0->HoveredIdNotActiveTimer =
         (stack0xfffffffffffffff0->IO).DeltaTime + stack0xfffffffffffffff0->HoveredIdNotActiveTimer;
  }
  stack0xfffffffffffffff0->HoveredIdPreviousFrame = stack0xfffffffffffffff0->HoveredId;
  stack0xfffffffffffffff0->HoveredIdPreviousFrameUsingMouseWheel =
       (bool)(stack0xfffffffffffffff0->HoveredIdUsingMouseWheel & 1);
  stack0xfffffffffffffff0->HoveredId = 0;
  stack0xfffffffffffffff0->HoveredIdAllowOverlap = false;
  stack0xfffffffffffffff0->HoveredIdUsingMouseWheel = false;
  stack0xfffffffffffffff0->HoveredIdDisabled = false;
  if (((stack0xfffffffffffffff0->ActiveIdIsAlive != stack0xfffffffffffffff0->ActiveId) &&
      (stack0xfffffffffffffff0->ActiveIdPreviousFrame == stack0xfffffffffffffff0->ActiveId)) &&
     (stack0xfffffffffffffff0->ActiveId != 0)) {
    ClearActiveID();
  }
  if (stack0xfffffffffffffff0->ActiveId != 0) {
    stack0xfffffffffffffff0->ActiveIdTimer =
         (stack0xfffffffffffffff0->IO).DeltaTime + stack0xfffffffffffffff0->ActiveIdTimer;
  }
  stack0xfffffffffffffff0->LastActiveIdTimer =
       (stack0xfffffffffffffff0->IO).DeltaTime + stack0xfffffffffffffff0->LastActiveIdTimer;
  stack0xfffffffffffffff0->ActiveIdPreviousFrame = stack0xfffffffffffffff0->ActiveId;
  stack0xfffffffffffffff0->ActiveIdPreviousFrameWindow = stack0xfffffffffffffff0->ActiveIdWindow;
  stack0xfffffffffffffff0->ActiveIdPreviousFrameHasBeenEditedBefore =
       (bool)(stack0xfffffffffffffff0->ActiveIdHasBeenEditedBefore & 1);
  stack0xfffffffffffffff0->ActiveIdIsAlive = 0;
  stack0xfffffffffffffff0->ActiveIdHasBeenEditedThisFrame = false;
  stack0xfffffffffffffff0->ActiveIdPreviousFrameIsAlive = false;
  stack0xfffffffffffffff0->ActiveIdIsJustActivated = false;
  if ((stack0xfffffffffffffff0->TempInputId != 0) &&
     (stack0xfffffffffffffff0->ActiveId != stack0xfffffffffffffff0->TempInputId)) {
    stack0xfffffffffffffff0->TempInputId = 0;
  }
  if (stack0xfffffffffffffff0->ActiveId == 0) {
    stack0xfffffffffffffff0->ActiveIdUsingNavDirMask = 0;
    stack0xfffffffffffffff0->ActiveIdUsingNavInputMask = 0;
    ImBitArray<133,_-512>::ClearAllBits(&stack0xfffffffffffffff0->ActiveIdUsingKeyInputMask);
  }
  stack0xfffffffffffffff0->DragDropAcceptIdPrev = stack0xfffffffffffffff0->DragDropAcceptIdCurr;
  stack0xfffffffffffffff0->DragDropAcceptIdCurr = 0;
  stack0xfffffffffffffff0->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  stack0xfffffffffffffff0->DragDropWithinSource = false;
  stack0xfffffffffffffff0->DragDropWithinTarget = false;
  stack0xfffffffffffffff0->DragDropHoldJustPressedId = 0;
  ImVector<ImGuiInputEvent>::resize(&stack0xfffffffffffffff0->InputEventsTrail,0);
  UpdateInputEvents((bool)((stack0xfffffffffffffff0->IO).ConfigInputTrickleEventQueue & 1));
  UpdateKeyboardInputs();
  NavUpdate();
  UpdateMouseInputs();
  DockContextNewFrameUpdateUndocking(stack0xfffffffffffffff0);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar6 = GetTopMostPopupModal();
  if ((pIVar6 != (ImGuiWindow *)0x0) ||
     ((stack0xfffffffffffffff0->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < stack0xfffffffffffffff0->NavWindowingHighlightAlpha)))) {
    fVar10 = ImMin<float>((stack0xfffffffffffffff0->IO).DeltaTime * 6.0 +
                          stack0xfffffffffffffff0->DimBgRatio,1.0);
    stack0xfffffffffffffff0->DimBgRatio = fVar10;
  }
  else {
    fVar10 = ImMax<float>(-(stack0xfffffffffffffff0->IO).DeltaTime * 10.0 +
                          stack0xfffffffffffffff0->DimBgRatio,0.0);
    stack0xfffffffffffffff0->DimBgRatio = fVar10;
  }
  stack0xfffffffffffffff0->MouseCursor = 0;
  stack0xfffffffffffffff0->WantTextInputNextFrame = -1;
  stack0xfffffffffffffff0->WantCaptureKeyboardNextFrame = -1;
  stack0xfffffffffffffff0->WantCaptureMouseNextFrame = -1;
  uVar1 = *(undefined3 *)&(stack0xfffffffffffffff0->PlatformImeData).field_0x1;
  fVar10 = (stack0xfffffffffffffff0->PlatformImeData).InputPos.x;
  (unique0x10001233->PlatformImeDataPrev).WantVisible =
       (stack0xfffffffffffffff0->PlatformImeData).WantVisible;
  *(undefined3 *)&(unique0x10001233->PlatformImeDataPrev).field_0x1 = uVar1;
  (unique0x10001233->PlatformImeDataPrev).InputPos.x = fVar10;
  *(undefined8 *)&(stack0xfffffffffffffff0->PlatformImeDataPrev).InputPos.y =
       *(undefined8 *)&(stack0xfffffffffffffff0->PlatformImeData).InputPos.y;
  (stack0xfffffffffffffff0->PlatformImeData).WantVisible = false;
  UpdateMouseWheel();
  if ((stack0xfffffffffffffff0->WindowsFocusOrder).Size <= (stack0xfffffffffffffff0->Windows).Size)
  {
    if (((stack0xfffffffffffffff0->GcCompactAll & 1U) != 0) ||
       (pfVar8 = &(stack0xfffffffffffffff0->IO).ConfigMemoryCompactTimer,
       *pfVar8 <= 0.0 && *pfVar8 != 0.0)) {
      local_90 = 3.4028235e+38;
    }
    else {
      local_90 = (float)stack0xfffffffffffffff0->Time -
                 (stack0xfffffffffffffff0->IO).ConfigMemoryCompactTimer;
    }
    window._4_4_ = local_90;
    for (window._0_4_ = 0; (int)window != (stack0xfffffffffffffff0->Windows).Size;
        window._0_4_ = (int)window + 1) {
      ppIVar7 = ImVector<ImGuiWindow_*>::operator[](&stack0xfffffffffffffff0->Windows,(int)window);
      _i_2 = *ppIVar7;
      _i_2->WasActive = (bool)(_i_2->Active & 1);
      _i_2->BeginCount = 0;
      _i_2->Active = false;
      _i_2->WriteAccessed = false;
      if ((((_i_2->WasActive & 1U) == 0) && ((_i_2->MemoryCompacted & 1U) == 0)) &&
         (_i_2->LastTimeActive < window._4_4_)) {
        GcCompactTransientWindowBuffers(_i_2);
      }
    }
    for (local_6c = 0; local_6c < (stack0xfffffffffffffff0->TablesLastTimeActive).Size;
        local_6c = local_6c + 1) {
      pfVar8 = ImVector<float>::operator[](&stack0xfffffffffffffff0->TablesLastTimeActive,local_6c);
      if ((0.0 <= *pfVar8) &&
         (pfVar8 = ImVector<float>::operator[]
                             (&stack0xfffffffffffffff0->TablesLastTimeActive,local_6c),
         *pfVar8 < window._4_4_)) {
        table = ImPool<ImGuiTable>::GetByIndex(&stack0xfffffffffffffff0->Tables,local_6c);
        TableGcCompactTransientBuffers(table);
      }
    }
    for (local_70 = 0; local_70 < (stack0xfffffffffffffff0->TablesTempData).Size;
        local_70 = local_70 + 1) {
      pIVar9 = ImVector<ImGuiTableTempData>::operator[]
                         (&stack0xfffffffffffffff0->TablesTempData,local_70);
      if ((0.0 <= pIVar9->LastTimeActive) &&
         (pIVar9 = ImVector<ImGuiTableTempData>::operator[]
                             (&stack0xfffffffffffffff0->TablesTempData,local_70),
         pIVar9->LastTimeActive < window._4_4_)) {
        pIVar9 = ImVector<ImGuiTableTempData>::operator[]
                           (&stack0xfffffffffffffff0->TablesTempData,local_70);
        TableGcCompactTransientBuffers(pIVar9);
      }
    }
    if ((stack0xfffffffffffffff0->GcCompactAll & 1U) != 0) {
      GcCompactTransientMiscBuffers();
    }
    stack0xfffffffffffffff0->GcCompactAll = false;
    if ((stack0xfffffffffffffff0->NavWindow != (ImGuiWindow *)0x0) &&
       ((stack0xfffffffffffffff0->NavWindow->WasActive & 1U) == 0)) {
      FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
    }
    ImVector<ImGuiWindowStackData>::resize(&stack0xfffffffffffffff0->CurrentWindowStack,0);
    ImVector<ImGuiPopupData>::resize(&stack0xfffffffffffffff0->BeginPopupStack,0);
    ImVector<int>::resize(&stack0xfffffffffffffff0->ItemFlagsStack,0);
    local_74 = 0;
    ImVector<int>::push_back(&stack0xfffffffffffffff0->ItemFlagsStack,&local_74);
    ImVector<ImGuiGroupData>::resize(&stack0xfffffffffffffff0->GroupStack,0);
    DockContextNewFrameUpdateDocking(stack0xfffffffffffffff0);
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();
    stack0xfffffffffffffff0->WithinFrameScopeWithImplicitWindow = true;
    ImVec2::ImVec2(&local_7c,400.0,400.0);
    SetNextWindowSize(&local_7c,4);
    Begin("Debug##Default",(bool *)0x0,0);
    if ((stack0xfffffffffffffff0->CurrentWindow->IsFallbackWindow & 1U) == 1) {
      CallContextHooks(stack0xfffffffffffffff0,ImGuiContextHookType_NewFramePost);
      return;
    }
    __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x1217,"void ImGui::NewFrame()");
  }
  __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x11e4,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    ErrorCheckNewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask.ClearAllBits();
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextNewFrameUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // Docking
    DockContextNewFrameUpdateDocking(&g);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}